

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O3

size_t nivalis::detail::print_ast_latex(ostream *os,AST *ast,Environment *env,size_t idx)

{
  byte bVar1;
  uint uVar2;
  pointer pAVar3;
  pointer pUVar4;
  pointer pbVar5;
  char *pcVar6;
  size_t sVar7;
  ostream *poVar8;
  long lVar9;
  size_type sVar10;
  size_t idx_00;
  size_t i;
  ulong uVar11;
  char *pcVar12;
  char *pcVar13;
  long lVar14;
  ulong uVar15;
  size_t sVar16;
  long lStack_80;
  undefined8 uStack_78;
  size_t sStack_70;
  AST *pAStack_68;
  char *pcStack_60;
  ostream *poStack_58;
  code *pcStack_50;
  byte local_41;
  long local_40;
  Environment *local_38;
  
  pcStack_50 = (code *)0x113fce;
  pcVar6 = OpCode::latex_repr((ast->
                              super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                              )._M_impl.super__Vector_impl_data._M_start[idx].opcode);
  idx_00 = idx + 1;
  pAVar3 = (ast->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_38 = env;
  if (pAVar3[idx].opcode == 0xc) {
    if (env == (Environment *)0x0) {
      pcStack_50 = (code *)0x114179;
      std::__ostream_insert<char,std::char_traits<char>>(os,"<function id=",0xd);
      pcStack_50 = (code *)0x114189;
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)os);
      pcStack_50 = (code *)0x1141a0;
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
      pcStack_50 = (code *)0x1141b0;
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
      pcVar6 = " args>";
      sVar10 = 6;
    }
    else {
      uVar2 = pAVar3[idx].field_1.call_info[0];
      pUVar4 = (env->funcs).
               super__Vector_base<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pcVar6 = pUVar4[uVar2].name._M_dataplus._M_p;
      sVar10 = pUVar4[uVar2].name._M_string_length;
      poVar8 = os;
    }
    pcStack_50 = (code *)0x1141c4;
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar6,sVar10);
    uVar15 = (ulong)(ast->
                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                    )._M_impl.super__Vector_impl_data._M_start[idx].field_1.call_info[1];
    if (uVar15 != 0) {
      pcStack_50 = (code *)0x1141e6;
      std::__ostream_insert<char,std::char_traits<char>>(os,"\\left(",6);
      uVar11 = 0;
      do {
        if (uVar11 != 0) {
          pcStack_50 = (code *)0x114204;
          std::__ostream_insert<char,std::char_traits<char>>(os,",",1);
        }
        pcStack_50 = (code *)0x114217;
        idx_00 = print_ast_latex(os,ast,local_38,idx_00);
        uVar11 = uVar11 + 1;
      } while (uVar15 != uVar11);
      pcStack_50 = (code *)0x114236;
      std::__ostream_insert<char,std::char_traits<char>>(os,"\\right)",7);
    }
  }
  else {
    pcStack_50 = (code *)0x114018;
    local_40 = idx * 0x10;
    sVar7 = strlen(pcVar6);
    if (sVar7 != 0) {
      sVar16 = 0;
      do {
        bVar1 = pcVar6[sVar16];
        if (bVar1 < 0xd) {
          if (bVar1 != 9) {
            if (bVar1 != 0xb) {
LAB_00114101:
              sVar10 = 1;
              pcVar13 = (char *)&local_41;
              local_41 = bVar1;
              goto LAB_0011414f;
            }
            pcStack_50 = (code *)0x11408f;
            std::ostream::_M_insert<double>
                      (*(double *)
                        ((long)&((ast->
                                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                 )._M_impl.super__Vector_impl_data._M_start)->field_1 + local_40));
          }
        }
        else if (bVar1 == 0xd) {
          if (local_38 == (Environment *)0x0) {
            pcVar12 = "\\@";
            goto LAB_00114123;
          }
          pcVar12 = *(char **)((long)&((ast->
                                       super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                       )._M_impl.super__Vector_impl_data._M_start)->field_1 +
                              local_40);
          if (pcVar12 < (char *)((long)(local_38->vars).
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data._M_finish -
                                 (long)(local_38->vars).
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data._M_start >> 3)) {
            pbVar5 = (local_38->varname).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if ((char *)((long)(local_38->varname).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar5 >> 5) <=
                pcVar12) {
              pcVar13 = "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)";
              pcStack_50 = Expr::to_bin;
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                        );
              lStack_80 = *(long *)((long)pcVar13 + 8) - *(long *)pcVar13 >> 4;
              lVar14 = 8;
              sStack_70 = idx_00;
              pAStack_68 = ast;
              pcStack_60 = pcVar6;
              poStack_58 = os;
              pcStack_50 = (code *)sVar16;
              std::ostream::write(pcVar12,(long)&lStack_80);
              lVar9 = *(long *)pcVar13;
              if (*(long *)((long)pcVar13 + 8) != lVar9) {
                uVar15 = 0;
                do {
                  uStack_78 = *(undefined8 *)(lVar9 + lVar14);
                  lStack_80 = CONCAT44(lStack_80._4_4_,*(undefined4 *)(lVar9 + -8 + lVar14));
                  std::ostream::write(pcVar12,(long)&lStack_80);
                  uVar15 = uVar15 + 1;
                  lVar9 = *(long *)pcVar13;
                  lVar14 = lVar14 + 0x10;
                } while (uVar15 < (ulong)(*(long *)((long)pcVar13 + 8) - lVar9 >> 4));
              }
              return (size_t)pcVar12;
            }
            pcVar13 = pbVar5[(long)pcVar12]._M_dataplus._M_p;
            sVar10 = pbVar5[(long)pcVar12]._M_string_length;
          }
          else {
            sVar10 = 6;
            pcVar13 = "\\&NULL";
          }
LAB_0011414f:
          pcStack_50 = (code *)0x114154;
          std::__ostream_insert<char,std::char_traits<char>>(os,pcVar13,sVar10);
        }
        else if (bVar1 == 0x24) {
          pcVar12 = "\\$";
LAB_00114123:
          pcStack_50 = (code *)0x114128;
          std::__ostream_insert<char,std::char_traits<char>>(os,pcVar12,2);
          pcStack_50 = (code *)0x11413e;
          std::ostream::_M_insert<unsigned_long>((ulong)os);
        }
        else {
          if (bVar1 != 0x40) goto LAB_00114101;
          pcStack_50 = (code *)0x11405e;
          idx_00 = print_ast_latex(os,ast,local_38,idx_00);
        }
        sVar16 = sVar16 + 1;
      } while (sVar7 != sVar16);
    }
  }
  return idx_00;
}

Assistant:

size_t print_ast_latex(std::ostream& os, const Expr::AST& ast,
               const Environment* env, size_t idx) {
    std::string_view reprs = OpCode::latex_repr(ast[idx].opcode);
    size_t n_idx = idx + 1;
    if (ast[idx].opcode == OpCode::call) {
        // Special handling for user function
        if (env != nullptr) {
            os << env->funcs[ast[idx].call_info[0]].name;
        } else {
            os << "<function id=" << ast[idx].call_info[0] << ", " << ast[idx].call_info[1] << " args>";
        }
        size_t n_args = ast[idx].call_info[1];
        if (n_args) {
            os << "\\left(";
            for (size_t i = 0; i < n_args; ++i) {
                if (i) os << ",";
                n_idx = print_ast_latex(os, ast, env, n_idx);
            }
            os << "\\right)";
        }
    } else {
        for (char c : reprs) {
            switch(c) {
                case '@': n_idx = print_ast_latex(os, ast, env, n_idx); break; // subexpr
                case '\v': os << ast[idx].val; break; // value
                case '\r':
                          if (env != nullptr) {
                              if (ast[idx].ref >= env->vars.size()) {
                                  os << "\\&NULL";
                                  break;
                              } os << env->varname.at(ast[idx].ref);
                          }
                          else os << "\\@" << ast[idx].ref;
                          break; // ref
                case '\t':
                          // Not used
                          break;
                case '$':
                          os << "\\$" << ast[idx].ref;
                          break;
                default: os << c;
            }
        }
    }
    return n_idx;
}